

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_llc(compiler_state_t *cstate)

{
  int iVar1;
  block *pbVar2;
  block *b1;
  block *b0;
  compiler_state_t *cstate_local;
  
  iVar1 = cstate->linktype;
  if (iVar1 == 1) {
    pbVar2 = gen_cmp_gt(cstate,OR_LINKTYPE,0,8,0x5dc);
    gen_not(pbVar2);
    cstate_local = (compiler_state_t *)gen_cmp(cstate,OR_LLC,0,8,0xffff);
    gen_not((block *)cstate_local);
    gen_and(pbVar2,(block *)cstate_local);
  }
  else if (iVar1 == 6) {
    cstate_local = (compiler_state_t *)gen_true(cstate);
  }
  else if (iVar1 == 10) {
    cstate_local = (compiler_state_t *)gen_true(cstate);
  }
  else if (iVar1 == 0xb) {
    cstate_local = (compiler_state_t *)gen_true(cstate);
  }
  else {
    if ((iVar1 != 0x69) && (iVar1 != 0x77)) {
      if (iVar1 == 0x7b) {
        pbVar2 = gen_atmtype_abbrev(cstate,0x1f);
        return pbVar2;
      }
      if (((iVar1 != 0x7f) && (iVar1 != 0xa3)) && (iVar1 != 0xc0)) {
        bpf_error(cstate,"\'llc\' not supported for linktype %d",(ulong)(uint)cstate->linktype);
        return (block *)cstate_local;
      }
    }
    cstate_local = (compiler_state_t *)gen_check_802_11_data_frame(cstate);
  }
  return (block *)cstate_local;
}

Assistant:

struct block *
gen_llc(compiler_state_t *cstate)
{
	struct block *b0, *b1;

	switch (cstate->linktype) {

	case DLT_EN10MB:
		/*
		 * We check for an Ethernet type field less than
		 * 1500, which means it's an 802.3 length field.
		 */
		b0 = gen_cmp_gt(cstate, OR_LINKTYPE, 0, BPF_H, ETHERMTU);
		gen_not(b0);

		/*
		 * Now check for the purported DSAP and SSAP not being
		 * 0xFF, to rule out NetWare-over-802.3.
		 */
		b1 = gen_cmp(cstate, OR_LLC, 0, BPF_H, (bpf_int32)0xFFFF);
		gen_not(b1);
		gen_and(b0, b1);
		return b1;

	case DLT_SUNATM:
		/*
		 * We check for LLC traffic.
		 */
		b0 = gen_atmtype_abbrev(cstate, A_LLC);
		return b0;

	case DLT_IEEE802:	/* Token Ring */
		/*
		 * XXX - check for LLC frames.
		 */
		return gen_true(cstate);

	case DLT_FDDI:
		/*
		 * XXX - check for LLC frames.
		 */
		return gen_true(cstate);

	case DLT_ATM_RFC1483:
		/*
		 * For LLC encapsulation, these are defined to have an
		 * 802.2 LLC header.
		 *
		 * For VC encapsulation, they don't, but there's no
		 * way to check for that; the protocol used on the VC
		 * is negotiated out of band.
		 */
		return gen_true(cstate);

	case DLT_IEEE802_11:
	case DLT_PRISM_HEADER:
	case DLT_IEEE802_11_RADIO:
	case DLT_IEEE802_11_RADIO_AVS:
	case DLT_PPI:
		/*
		 * Check that we have a data frame.
		 */
		b0 = gen_check_802_11_data_frame(cstate);
		return b0;

	default:
		bpf_error(cstate, "'llc' not supported for linktype %d", cstate->linktype);
		/* NOTREACHED */
	}
}